

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# civetweb.c
# Opt level: O3

int should_keep_alive(mg_connection *conn)

{
  byte bVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  __int32_t **pp_Var5;
  char *pcVar6;
  long lVar7;
  long lVar8;
  vec opt_vec;
  vec eq_vec;
  vec local_50;
  vec local_40;
  
  iVar4 = 0;
  if ((conn != (mg_connection *)0x0) && (iVar4 = 0, conn->must_close == 0)) {
    pcVar6 = conn->dom_ctx->config[10];
    pp_Var5 = __ctype_tolower_loc();
    lVar7 = 0;
    do {
      bVar1 = pcVar6[lVar7];
      iVar2 = (*pp_Var5)[bVar1];
      iVar3 = (*pp_Var5)[(byte)"yes"[lVar7]];
      if (bVar1 == 0) break;
      lVar7 = lVar7 + 1;
    } while (iVar2 == iVar3);
    iVar4 = 0;
    if (iVar2 == iVar3) {
      iVar4 = conn->connection_type;
      if (iVar4 == 1) {
        lVar7 = 0xa0;
        lVar8 = 0xa8;
      }
      else {
        if (iVar4 != 2) {
          return 0;
        }
        lVar7 = 0x4d8;
        lVar8 = 0x4e0;
      }
      pcVar6 = get_header((mg_header *)((conn->request_info).remote_addr + lVar8 + -0x48),
                          *(int *)((conn->request_info).remote_addr + lVar7 + -0x48),"Connection");
      if (pcVar6 == (char *)0x0) {
        if (iVar4 == 1) {
          lVar7 = 0x30;
        }
        else {
          if (iVar4 != 2) {
            return 0;
          }
          lVar7 = 0x4c8;
        }
        pcVar6 = *(char **)((conn->request_info).remote_addr + lVar7 + -0x48);
        if (pcVar6 == (char *)0x0) {
          return 0;
        }
        iVar4 = strcmp(pcVar6,"1.1");
        if (iVar4 != 0) {
          return 0;
        }
      }
      else {
        do {
          pcVar6 = next_option(pcVar6,&local_50,&local_40);
          if (pcVar6 == (char *)0x0) {
            return 0;
          }
          iVar4 = mg_strncasecmp("keep-alive",local_50.ptr,local_50.len);
        } while (iVar4 != 0);
      }
      iVar4 = 1;
    }
  }
  return iVar4;
}

Assistant:

static int
should_keep_alive(const struct mg_connection *conn)
{
	const char *http_version;
	const char *header;

	/* First satisfy needs of the server */
	if ((conn == NULL) || conn->must_close) {
		/* Close, if civetweb framework needs to close */
		return 0;
	}

	if (mg_strcasecmp(conn->dom_ctx->config[ENABLE_KEEP_ALIVE], "yes") != 0) {
		/* Close, if keep alive is not enabled */
		return 0;
	}

	/* Check explicit wish of the client */
	header = mg_get_header(conn, "Connection");
	if (header) {
		/* If there is a connection header from the client, obey */
		if (header_has_option(header, "keep-alive")) {
			return 1;
		}
		return 0;
	}

	/* Use default of the standard */
	http_version = get_http_version(conn);
	if (http_version && (0 == strcmp(http_version, "1.1"))) {
		/* HTTP 1.1 default is keep alive */
		return 1;
	}

	/* HTTP 1.0 (and earlier) default is to close the connection */
	return 0;
}